

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * __thiscall
testing::internal::FormatCxxExceptionMessage_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,char *description,char *location)

{
  stringstream *in_RAX;
  size_t sVar1;
  string *psVar2;
  long lVar3;
  char *pcVar4;
  ostream *poVar5;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  
  local_28.ptr_ = in_RAX;
  Message::Message((Message *)&local_28);
  poVar5 = (ostream *)(local_28.ptr_ + 0x10);
  if (this == (internal *)0x0) {
    lVar3 = 0x15;
    pcVar4 = "Unknown C++ exception";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"C++ exception with description \"",0x20);
    poVar5 = (ostream *)(local_28.ptr_ + 0x10);
    sVar1 = strlen((char *)this);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)this,sVar1);
    poVar5 = (ostream *)(local_28.ptr_ + 0x10);
    lVar3 = 1;
    pcVar4 = "\"";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar4,lVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_28.ptr_ + 0x10)," thrown in ",0xb);
  poVar5 = (ostream *)(local_28.ptr_ + 0x10);
  if (description == (char *)0x0) {
    sVar1 = 6;
    description = "(null)";
  }
  else {
    sVar1 = strlen(description);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,description,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_28.ptr_ + 0x10),".",1);
  psVar2 = StringStreamToString(__return_storage_ptr__,local_28.ptr_);
  if (local_28.ptr_ != (stringstream *)0x0) {
    psVar2 = (string *)(**(code **)(*(long *)local_28.ptr_ + 8))();
  }
  return psVar2;
}

Assistant:

static std::string FormatCxxExceptionMessage(const char* description,
                                             const char* location) {
  Message message;
  if (description != NULL) {
    message << "C++ exception with description \"" << description << "\"";
  } else {
    message << "Unknown C++ exception";
  }
  message << " thrown in " << location << ".";

  return message.GetString();
}